

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O3

Lazy<bool> __thiscall
cinatra::coro_http_client::timeout<coro_io::period_timer>
          (coro_http_client *this,period_timer *timer,duration duration,string *msg)

{
  long *plVar1;
  long lVar2;
  char *pcVar3;
  element_type *peVar4;
  array<cinatra::http_header,_100UL> *paVar5;
  long *in_R8;
  
  peVar4 = (element_type *)operator_new(0x98,(nothrow_t *)&std::nothrow);
  if (peVar4 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar4->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         timeout<coro_io::period_timer>;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar4->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)timeout<coro_io::period_timer>;
    ((string_view *)((long)(peVar4->parser_).headers_._M_elems + 0x30))->_M_len = duration.__r;
    *(period_timer **)((long)(peVar4->parser_).headers_._M_elems + 0x28) = timer;
    ((string_view *)((long)(peVar4->parser_).headers_._M_elems + 0x10))->_M_len = (size_t)msg;
    paVar5 = &(peVar4->parser_).headers_;
    (peVar4->parser_).body_len_ = (int64_t)paVar5;
    plVar1 = in_R8 + 2;
    if ((long *)*in_R8 == plVar1) {
      pcVar3 = (char *)in_R8[3];
      paVar5->_M_elems[0].name._M_len = *plVar1;
      *(char **)((long)(peVar4->parser_).headers_._M_elems + 8) = pcVar3;
    }
    else {
      (peVar4->parser_).body_len_ = *in_R8;
      (peVar4->parser_).headers_._M_elems[0].name._M_len = *plVar1;
    }
    lVar2 = in_R8[1];
    (peVar4->parser_).has_connection_ = (bool)(char)lVar2;
    (peVar4->parser_).has_close_ = (bool)(char)((ulong)lVar2 >> 8);
    (peVar4->parser_).has_upgrade_ = (bool)(char)((ulong)lVar2 >> 0x10);
    *(int5 *)&(peVar4->parser_).field_0x33 = (int5)((ulong)lVar2 >> 0x18);
    *in_R8 = (long)plVar1;
    in_R8[1] = 0;
    *(undefined1 *)(in_R8 + 2) = 0;
    (peVar4->parser_).msg_._M_str = (char *)0x0;
    *(undefined8 *)&peVar4->parser_ = 0;
    (peVar4->parser_).msg_._M_len = 0;
    *(undefined1 *)&(peVar4->parser_).header_len_ = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
    *(undefined1 *)((long)(peVar4->parser_).headers_._M_elems + 0x48) = 0;
  }
  return (LazyBase<bool,_false>)(LazyBase<bool,_false>)this;
}

Assistant:

async_simple::coro::Lazy<bool> timeout(
      auto &timer, std::chrono::steady_clock::duration duration,
      std::string msg) {
    auto watcher = std::weak_ptr(socket_);
    timer.expires_after(duration);
    auto is_timeout = co_await timer.async_await();
    if (!is_timeout) {
      co_return false;
    }
    if (auto socket = watcher.lock(); socket) {
      socket_->is_timeout_ = true;
      CINATRA_LOG_WARNING << msg << " timeout";
      close_socket(*socket_);
    }
    co_return true;
  }